

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O3

S2Point * S2::S2PointFromExact(S2Point *__return_storage_ptr__,Vector3_xf *xf)

{
  int32 iVar1;
  S2Point *pSVar2;
  int extraout_EAX;
  S2Point *extraout_RAX;
  S2Point *extraout_RAX_00;
  int iVar3;
  int iVar4;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double dVar5;
  double dVar6;
  ExactFloat EStack_d8;
  ExactFloat local_c8;
  ExactFloat local_b8;
  S2Point *local_a8;
  double local_98;
  ExactFloat *local_88;
  ExactFloat local_78;
  ExactFloat local_68;
  ExactFloat local_58;
  double local_48;
  
  ExactFloat::ExactFloat(&EStack_d8,xf->c_);
  local_a8 = (S2Point *)ExactFloat::ToDouble(&EStack_d8);
  ExactFloat::ExactFloat(&local_b8,xf->c_ + 1);
  local_88 = (ExactFloat *)ExactFloat::ToDouble(&local_b8);
  ExactFloat::ExactFloat(&local_c8,xf->c_ + 2);
  local_98 = ExactFloat::ToDouble(&local_c8);
  BN_free((BIGNUM *)local_c8.bn_.bn_);
  BN_free((BIGNUM *)local_b8.bn_.bn_);
  BN_free((BIGNUM *)EStack_d8.bn_.bn_);
  dVar5 = local_98 * local_98 +
          (double)local_88 * (double)local_88 + (double)local_a8 * (double)local_a8;
  if (dVar5 <= 0.0) {
    iVar3 = -0xbebc201;
    iVar4 = 0;
    local_a8 = __return_storage_ptr__;
    local_88 = xf->c_ + 2;
    do {
      util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                ((BasicVector<Vector3,_ExactFloat,_3UL> *)&EStack_d8,(int)xf);
      iVar1 = EStack_d8.bn_exp_;
      BN_free((BIGNUM *)EStack_d8.bn_.bn_);
      if (iVar1 < 0x7ffffffd) {
        util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                  ((BasicVector<Vector3,_ExactFloat,_3UL> *)&EStack_d8,(int)xf);
        ExactFloat::exp(&EStack_d8,__x);
        BN_free((BIGNUM *)EStack_d8.bn_.bn_);
        if (iVar3 <= extraout_EAX) {
          iVar3 = extraout_EAX;
        }
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 3);
    if (iVar3 < -200000000) {
      local_a8->c_[0] = 0.0;
      local_a8->c_[1] = 0.0;
      local_a8->c_[2] = 0.0;
    }
    else {
      ExactFloat::ExactFloat(&local_b8,xf->c_);
      ldexp(__x_00,(int)&EStack_d8);
      pSVar2 = local_a8;
      local_98 = ExactFloat::ToDouble(&EStack_d8);
      ExactFloat::ExactFloat(&local_58,xf->c_ + 1);
      ldexp(__x_01,(int)&local_c8);
      local_48 = ExactFloat::ToDouble(&local_c8);
      ExactFloat::ExactFloat(&local_78,local_88);
      ldexp(__x_02,(int)&local_68);
      dVar5 = ExactFloat::ToDouble(&local_68);
      dVar6 = SQRT(dVar5 * dVar5 + local_48 * local_48 + local_98 * local_98);
      dVar6 = (double)(~-(ulong)(dVar6 != 0.0) & (ulong)dVar6 |
                      (ulong)(1.0 / dVar6) & -(ulong)(dVar6 != 0.0));
      pSVar2->c_[0] = dVar6 * local_98;
      pSVar2->c_[1] = dVar6 * local_48;
      pSVar2->c_[2] = dVar6 * dVar5;
      BN_free((BIGNUM *)local_68.bn_.bn_);
      BN_free((BIGNUM *)local_78.bn_.bn_);
      BN_free((BIGNUM *)local_c8.bn_.bn_);
      BN_free((BIGNUM *)local_58.bn_.bn_);
      BN_free((BIGNUM *)EStack_d8.bn_.bn_);
      BN_free((BIGNUM *)local_b8.bn_.bn_);
      local_a8 = extraout_RAX_00;
    }
  }
  else {
    dVar5 = SQRT(dVar5);
    dVar5 = (double)(~-(ulong)(dVar5 != 0.0) & (ulong)dVar5 |
                    (ulong)(1.0 / dVar5) & -(ulong)(dVar5 != 0.0));
    __return_storage_ptr__->c_[0] = dVar5 * (double)local_a8;
    __return_storage_ptr__->c_[1] = dVar5 * (double)local_88;
    __return_storage_ptr__->c_[2] = local_98 * dVar5;
    local_a8 = extraout_RAX;
  }
  return local_a8;
}

Assistant:

static S2Point S2PointFromExact(const Vector3_xf& xf) {
  // If all components of "x" have absolute value less than about 1e-154,
  // then x.Norm2() is zero in double precision due to underflow.  Therefore
  // we need to scale "x" by an appropriate power of 2 before the conversion.
  S2Point x(xf[0].ToDouble(), xf[1].ToDouble(), xf[2].ToDouble());
  if (x.Norm2() > 0) return x.Normalize();

  // Scale so that the largest component magnitude is in the range [0.5, 1).
  int exp = ExactFloat::kMinExp - 1;
  for (int i = 0; i < 3; ++i) {
    if (xf[i].is_normal()) exp = std::max(exp, xf[i].exp());
  }
  if (exp < ExactFloat::kMinExp) {
    return S2Point(0, 0, 0);
  }
  return S2Point(ldexp(xf[0], -exp).ToDouble(),
                 ldexp(xf[1], -exp).ToDouble(),
                 ldexp(xf[2], -exp).ToDouble()).Normalize();
}